

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_short,unsigned_short>
          (BaseAppender *this,Vector *col,unsigned_short input)

{
  unsigned_short uVar1;
  
  uVar1 = Cast::Operation<unsigned_short,unsigned_short>(input);
  *(unsigned_short *)(col->data + (this->chunk).count * 2) = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}